

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_orc_vec_mipsel
               (TCGContext_conflict4 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec r_00;
  uint vece_00;
  TCGv_vec pTVar1;
  uintptr_t o;
  
  pTVar1 = r;
  r_00 = tcg_temp_new_vec_matching_mipsel(tcg_ctx,r);
  vece_00 = (uint)pTVar1;
  tcg_gen_not_vec_mipsel(tcg_ctx,vece_00,r_00,b);
  tcg_gen_or_vec_mipsel(tcg_ctx,vece_00,r,a,r_00);
  tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_orc_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    if (TCG_TARGET_HAS_orc_vec) {
        vec_gen_op3(tcg_ctx, INDEX_op_orc_vec, 0, r, a, b);
    } else {
        TCGv_vec t = tcg_temp_new_vec_matching(tcg_ctx, r);
        tcg_gen_not_vec(tcg_ctx, 0, t, b);
        tcg_gen_or_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
}